

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalnull.c
# Opt level: O3

int fftnul(fitsfile *fptr,int colnum,LONGLONG nulvalue,int *status)

{
  uint uVar1;
  int iVar2;
  int hdutype;
  undefined8 uStack_28;
  
  uVar1 = *status;
  uStack_28 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    return uVar1;
  }
  iVar2 = ffghdt(fptr,(int *)((long)&uStack_28 + 4),status);
  if (iVar2 < 1) {
    if (uStack_28._4_4_ != 2) {
      *status = 0xe3;
      return 0xe3;
    }
    fptr->Fptr->tableptr[(long)colnum + -1].tnull = nulvalue;
  }
  return *status;
}

Assistant:

int fftnul(fitsfile *fptr,      /* I - FITS file pointer                  */
           int colnum,          /* I - column number to apply nulvalue to */
           LONGLONG nulvalue,   /* I - null pixel value: value of TNULLn  */
           int *status)         /* IO - error status                      */
/*
  Define the value used to represent undefined pixels in the BINTABLE column.
  This only applies to integer datatype columns (TFORM = B, I, or J).
  This routine overrides the null pixel value given by the TNULLn keyword
  if present.  Note that this routine does not write or modify the TNULLn
  keyword, but instead only modifies the value temporarily in the internal
  buffer. Thus, a subsequent call to the ffrdef routine will reset the null
  value back to the TNULLn  keyword value (or not defined if the keyword is not
  present).
*/
{
    tcolumn *colptr;
    int hdutype;

    if (*status > 0)
        return(*status);

    if (ffghdt(fptr, &hdutype, status) > 0)  /* get HDU type */
        return(*status);

    if (hdutype != BINARY_TBL)
        return(*status = NOT_BTABLE);        /* not proper HDU type */
 
    colptr = (fptr->Fptr)->tableptr;   /* set pointer to the first column */
    colptr += (colnum - 1);    /* increment to the correct column */

    colptr->tnull = nulvalue;

    return(*status);
}